

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O3

void hrstep2(double *inp,int N,int m,int p,int q,int pq,double *a,double *sos,double *var)

{
  uint rows;
  double *sig;
  double *col;
  double *C;
  double *C_00;
  double *x;
  int *ipiv;
  int iVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  double dVar12;
  double dVar13;
  
  iVar1 = q + m;
  rows = N - iVar1;
  lVar4 = (long)pq;
  sVar11 = (int)rows * lVar4 * 8;
  sig = (double *)malloc(sVar11);
  col = (double *)malloc(sVar11);
  sVar11 = lVar4 * 8;
  C = (double *)malloc(sVar11 * lVar4);
  C_00 = (double *)malloc(sVar11);
  x = (double *)malloc(sVar11);
  ipiv = (int *)malloc(lVar4 << 2);
  if (0 < (int)rows) {
    pdVar2 = sig + p;
    iVar3 = m + q + -1;
    uVar5 = 0;
    pdVar6 = sig;
    do {
      if (0 < p) {
        uVar9 = 0;
        iVar8 = iVar3;
        do {
          pdVar6[uVar9] = inp[iVar8];
          uVar9 = uVar9 + 1;
          iVar8 = iVar8 + -1;
        } while ((uint)p != uVar9);
      }
      if (0 < q) {
        uVar9 = 0;
        iVar8 = iVar3;
        do {
          pdVar2[uVar9] = -a[iVar8];
          uVar9 = uVar9 + 1;
          iVar8 = iVar8 + -1;
        } while ((uint)q != uVar9);
      }
      uVar5 = uVar5 + 1;
      pdVar6 = pdVar6 + lVar4;
      iVar3 = iVar3 + 1;
      pdVar2 = pdVar2 + lVar4;
    } while (uVar5 != rows);
  }
  mtranspose(sig,rows,pq,col);
  mmult(col,sig,C,pq,rows,pq);
  mmult(col,inp + (long)m + (long)q,C_00,pq,rows,1);
  ludecomp(C,pq,ipiv);
  linsolve(C,pq,C_00,ipiv,x);
  *sos = 0.0;
  dVar12 = 0.0;
  if (iVar1 < N) {
    lVar4 = (long)iVar1;
    lVar7 = (lVar4 << 0x20) + -0x100000000;
    do {
      dVar13 = inp[lVar4];
      if (0 < p) {
        uVar5 = 0;
        lVar10 = lVar7;
        do {
          dVar13 = dVar13 - x[uVar5] * *(double *)((long)inp + (lVar10 >> 0x1d));
          uVar5 = uVar5 + 1;
          lVar10 = lVar10 + -0x100000000;
        } while ((uint)p != uVar5);
      }
      if (0 < q) {
        uVar5 = 0;
        lVar10 = lVar7;
        do {
          dVar13 = dVar13 + x[(long)p + uVar5] * *(double *)((long)a + (lVar10 >> 0x1d));
          uVar5 = uVar5 + 1;
          lVar10 = lVar10 + -0x100000000;
        } while ((uint)q != uVar5);
      }
      dVar12 = dVar12 + dVar13 * dVar13;
      *sos = dVar12;
      lVar4 = lVar4 + 1;
      lVar7 = lVar7 + 0x100000000;
    } while (lVar4 < N);
  }
  *var = dVar12 / (double)(int)rows;
  free(sig);
  free(col);
  free(C);
  free(C_00);
  free(ipiv);
  free(x);
  return;
}

Assistant:

void hrstep2(double *inp, int N, int m, int p, int q, int pq, double *a, double *sos, double *var) {
	double *z, *zt, *A, *b, *temp;
	int *ipiv;
	int i,j,k,t;
	double wmean;

	z = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	zt = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	A = (double*)malloc(sizeof(double)* pq * pq);
	b = (double*)malloc(sizeof(double)* pq);
	temp = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	for (i = 0; i < N - m - q; ++i) {
		t = i * pq;
		for (j = 0; j < p; ++j) {
			z[t + j] = inp[m + q + i - j - 1];
		}

		for (k = 0; k < q; ++k) {
			z[t + p + k] = -a[m + q + i - k - 1];
		}
	}

	mtranspose(z, N - m - q, pq, zt);
	mmult(zt, z, A, pq, N - m - q, pq);
	mmult(zt, inp + m + q, b, pq, N - m - q, 1);


	ludecomp(A, pq, ipiv);
	linsolve(A, pq, b, ipiv, temp);

	*sos = 0.0;

	for (t = m + q; t < N; ++t) {
		wmean = inp[t];
		for (i = 0; i < p; ++i) {
			wmean -= (temp[i] * inp[t - i - 1]);
		}

		for (i = 0; i < q; ++i) {
			wmean += (temp[i+p] * a[t - i - 1]);
		}

		*sos += (wmean*wmean);
	}

	*var = *sos / (N - m - q);

	free(z);
	free(zt);
	free(A);
	free(b);
	free(ipiv);
	free(temp);
}